

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

int Ivy_ObjLevelRNew(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  int *piVar2;
  int iVar3;
  int i;
  
  if ((p->fFanout == 0) || (p->vRequired == (Vec_Int_t *)0x0)) {
    __assert_fail("p->fFanout && p->vRequired",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyUtil.c"
                  ,0x1a6,"int Ivy_ObjLevelRNew(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = Vec_PtrAlloc(10);
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  iVar3 = 1000000;
  for (i = 0; i < vArray->nSize; i = i + 1) {
    piVar2 = (int *)Vec_PtrEntry(vArray,i);
    if (piVar2 == (int *)0x0) break;
    iVar1 = Vec_IntEntry(p->vRequired,*piVar2);
    if (iVar1 <= iVar3) {
      iVar3 = iVar1;
    }
  }
  Vec_PtrFree(vArray);
  return iVar3 + -1;
}

Assistant:

int Ivy_ObjLevelRNew( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, Required, LevelNew = 1000000;
    assert( p->fFanout && p->vRequired );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        Required = Vec_IntEntry(p->vRequired, pFanout->Id);
        LevelNew = IVY_MIN( LevelNew, Required );
    }
    Vec_PtrFree( vFanouts );
    return LevelNew - 1;
}